

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rle.cpp
# Opt level: O3

void duckdb::RLEScanPartialInternal<float,false>
               (ColumnSegment *segment,ColumnScanState *state,idx_t scan_count,Vector *result,
               idx_t result_offset)

{
  undefined4 uVar1;
  uint uVar2;
  _func_int *p_Var3;
  idx_t iVar4;
  data_ptr_t pdVar5;
  undefined1 auVar6 [16];
  pointer pSVar7;
  _func_int **pp_Var8;
  _func_int **pp_Var9;
  long lVar10;
  long lVar11;
  ulong uVar12;
  ulong uVar13;
  _func_int **pp_Var14;
  ulong uVar15;
  int iVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  int iVar22;
  undefined1 auVar21 [16];
  undefined1 auVar23 [16];
  
  pSVar7 = unique_ptr<duckdb::SegmentScanState,_std::default_delete<duckdb::SegmentScanState>,_true>
           ::operator->(&state->scan_state);
  optional_ptr<duckdb::FileBuffer,_true>::CheckValid
            ((optional_ptr<duckdb::FileBuffer,_true> *)(pSVar7 + 3));
  p_Var3 = pSVar7[3]._vptr_SegmentScanState[2];
  iVar4 = segment->offset;
  uVar2 = *(uint *)&pSVar7[6]._vptr_SegmentScanState;
  pdVar5 = result->data;
  Vector::SetVectorType(result,FLAT_VECTOR);
  auVar18 = _DAT_01d9abd0;
  auVar6 = _DAT_01d99b10;
  auVar17 = _DAT_01d99b00;
  uVar15 = scan_count + result_offset;
  if (result_offset < uVar15) {
    pp_Var9 = pSVar7[4]._vptr_SegmentScanState;
    pp_Var8 = pSVar7[5]._vptr_SegmentScanState;
    do {
      pp_Var14 = (_func_int **)(ulong)*(ushort *)(p_Var3 + (long)pp_Var9 * 2 + uVar2 + iVar4);
      uVar13 = (long)pp_Var14 - (long)pp_Var8;
      uVar12 = uVar15 - result_offset;
      uVar1 = *(undefined4 *)(p_Var3 + (long)pp_Var9 * 4 + iVar4 + 8);
      if (uVar12 < uVar13) {
        if (uVar15 != result_offset) {
          lVar10 = uVar12 + (uVar12 == 0);
          lVar11 = lVar10 + -1;
          auVar23._8_4_ = (int)lVar11;
          auVar23._0_8_ = lVar11;
          auVar23._12_4_ = (int)((ulong)lVar11 >> 0x20);
          uVar15 = 0;
          auVar23 = auVar23 ^ auVar6;
          auVar17 = _DAT_01d9abd0;
          auVar18 = _DAT_01d99b00;
          do {
            auVar20 = auVar18 ^ auVar6;
            iVar16 = auVar23._4_4_;
            if ((bool)(~(auVar20._4_4_ == iVar16 && auVar23._0_4_ < auVar20._0_4_ ||
                        iVar16 < auVar20._4_4_) & 1)) {
              *(undefined4 *)(pdVar5 + uVar15 * 4 + result_offset * 4) = uVar1;
            }
            if ((auVar20._12_4_ != auVar23._12_4_ || auVar20._8_4_ <= auVar23._8_4_) &&
                auVar20._12_4_ <= auVar23._12_4_) {
              *(undefined4 *)(pdVar5 + uVar15 * 4 + result_offset * 4 + 4) = uVar1;
            }
            iVar22 = SUB164(auVar17 ^ auVar6,4);
            if (iVar22 <= iVar16 &&
                (iVar22 != iVar16 || SUB164(auVar17 ^ auVar6,0) <= auVar23._0_4_)) {
              *(undefined4 *)(pdVar5 + uVar15 * 4 + result_offset * 4 + 8) = uVar1;
              *(undefined4 *)(pdVar5 + uVar15 * 4 + result_offset * 4 + 0xc) = uVar1;
            }
            uVar15 = uVar15 + 4;
            lVar11 = auVar18._8_8_;
            auVar18._0_8_ = auVar18._0_8_ + 4;
            auVar18._8_8_ = lVar11 + 4;
            lVar11 = auVar17._8_8_;
            auVar17._0_8_ = auVar17._0_8_ + 4;
            auVar17._8_8_ = lVar11 + 4;
          } while ((lVar10 + 3U & 0xfffffffffffffffc) != uVar15);
        }
        pSVar7[5]._vptr_SegmentScanState = (_func_int **)((long)pp_Var8 + uVar12);
        return;
      }
      if (pp_Var14 != pp_Var8) {
        lVar10 = uVar13 - 1;
        auVar19._8_4_ = (int)lVar10;
        auVar19._0_8_ = lVar10;
        auVar19._12_4_ = (int)((ulong)lVar10 >> 0x20);
        lVar10 = result_offset * 4;
        auVar19 = auVar19 ^ auVar6;
        uVar12 = 0;
        auVar20 = auVar17;
        auVar21 = auVar18;
        do {
          auVar23 = auVar20 ^ auVar6;
          iVar16 = auVar19._4_4_;
          if ((bool)(~(auVar23._4_4_ == iVar16 && auVar19._0_4_ < auVar23._0_4_ ||
                      iVar16 < auVar23._4_4_) & 1)) {
            *(undefined4 *)(pdVar5 + uVar12 * 4 + lVar10) = uVar1;
          }
          if ((auVar23._12_4_ != auVar19._12_4_ || auVar23._8_4_ <= auVar19._8_4_) &&
              auVar23._12_4_ <= auVar19._12_4_) {
            *(undefined4 *)(pdVar5 + uVar12 * 4 + lVar10 + 4) = uVar1;
          }
          iVar22 = SUB164(auVar21 ^ auVar6,4);
          if (iVar22 <= iVar16 && (iVar22 != iVar16 || SUB164(auVar21 ^ auVar6,0) <= auVar19._0_4_))
          {
            *(undefined4 *)(pdVar5 + uVar12 * 4 + lVar10 + 8) = uVar1;
            *(undefined4 *)(pdVar5 + uVar12 * 4 + lVar10 + 0xc) = uVar1;
          }
          uVar12 = uVar12 + 4;
          lVar11 = auVar20._8_8_;
          auVar20._0_8_ = auVar20._0_8_ + 4;
          auVar20._8_8_ = lVar11 + 4;
          lVar11 = auVar21._8_8_;
          auVar21._0_8_ = auVar21._0_8_ + 4;
          auVar21._8_8_ = lVar11 + 4;
        } while ((uVar13 + 3 & 0xfffffffffffffffc) != uVar12);
      }
      result_offset = result_offset + uVar13;
      pp_Var9 = (_func_int **)((long)pp_Var9 + 1);
      pSVar7[4]._vptr_SegmentScanState = pp_Var9;
      pSVar7[5]._vptr_SegmentScanState = (_func_int **)0x0;
      pp_Var8 = (_func_int **)0x0;
    } while (result_offset < uVar15);
  }
  return;
}

Assistant:

void RLEScanPartialInternal(ColumnSegment &segment, ColumnScanState &state, idx_t scan_count, Vector &result,
                            idx_t result_offset) {
	auto &scan_state = state.scan_state->Cast<RLEScanState<T>>();

	auto data = scan_state.handle.Ptr() + segment.GetBlockOffset();
	auto data_pointer = reinterpret_cast<T *>(data + RLEConstants::RLE_HEADER_SIZE);
	auto index_pointer = reinterpret_cast<rle_count_t *>(data + scan_state.rle_count_offset);

	// If we are scanning an entire Vector and it contains only a single run
	if (CanEmitConstantVector<ENTIRE_VECTOR>(scan_state.position_in_entry, index_pointer[scan_state.entry_pos],
	                                         scan_count)) {
		RLEScanConstant<T>(scan_state, index_pointer, data_pointer, scan_count, result);
		return;
	}

	auto result_data = FlatVector::GetData<T>(result);
	result.SetVectorType(VectorType::FLAT_VECTOR);

	idx_t result_end = result_offset + scan_count;
	while (result_offset < result_end) {
		rle_count_t run_end = index_pointer[scan_state.entry_pos];
		idx_t run_count = run_end - scan_state.position_in_entry;
		idx_t remaining_scan_count = result_end - result_offset;
		T element = data_pointer[scan_state.entry_pos];
		if (DUCKDB_UNLIKELY(run_count > remaining_scan_count)) {
			for (idx_t i = 0; i < remaining_scan_count; i++) {
				result_data[result_offset + i] = element;
			}
			scan_state.position_in_entry += remaining_scan_count;
			break;
		}

		for (idx_t i = 0; i < run_count; i++) {
			result_data[result_offset + i] = element;
		}

		result_offset += run_count;
		scan_state.ForwardToNextRun();
	}
}